

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

unsigned_fast_type
math::wide_integer::msb<11264u,unsigned_int,std::allocator<unsigned_int>,false>
          (uintwide_t<11264U,_unsigned_int,_std::allocator<unsigned_int>,_false> *x)

{
  long lVar1;
  pointer pvVar2;
  long lVar3;
  unsigned_fast_type uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(x->values).
                 super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                 elem_count;
  pvVar2 = (x->values).
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
  lVar5 = uVar6 << 2;
  do {
    if (lVar5 == 0) {
      return 0;
    }
    uVar6 = (ulong)((int)uVar6 - 1);
    lVar1 = lVar5 + -4;
    lVar3 = lVar5 + -4;
    lVar5 = lVar1;
  } while (*(int *)((long)pvVar2 + lVar3) == 0);
  uVar4 = detail::msb_helper<unsigned_int>((uint32_t *)((long)pvVar2 + lVar1));
  return uVar6 * 0x20 + uVar4;
}

Assistant:

constexpr auto size    () const -> size_type { return  elem_count; }